

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Shop::printMedicines(Shop *this)

{
  pointer pMVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  Medicine medicine;
  undefined1 local_c0 [48];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"ID");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Name");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = std::operator<<(poVar2,"Company Name");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Unit Price");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"In Stock");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Quantity");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Arrival Date");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Expire Date");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar4 = 0;
  for (uVar3 = 0;
      pMVar1 = (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->medicineList).
                             super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar1) / 0x90);
      uVar3 = uVar3 + 1) {
    Medicine::Medicine((Medicine *)local_c0,(Medicine *)((long)&pMVar1->id + lVar4));
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar3 + 1);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,(string *)(local_c0 + 0x10));
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"\t    ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c0._4_4_);
    poVar2 = std::operator<<(poVar2,"\t\t   ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\t\t  ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c0._8_4_);
    poVar2 = std::operator<<(poVar2,"\t\t  ");
    poVar2 = std::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    Medicine::~Medicine((Medicine *)local_c0);
    lVar4 = lVar4 + 0x90;
  }
  return;
}

Assistant:

void printMedicines() {
        cout << "ID" << "\t" << "Name" << "\t\t" << "Company Name" << "\t" << "Unit Price" << "\t" << "In Stock" << "\t"
             << "Quantity" << "\t" << "Arrival Date" << "\t" << "Expire Date" << endl;
        for (int i = 0; i < medicineList.size(); i++) {
            Medicine medicine = medicineList[i];
            cout << i + 1 << "\t" << medicine.getName() << "\t" << medicine.getCompanyName() << "\t    "
                 << medicine.getUnitePrice() << "\t\t   " << medicine.getIsStock() << "\t\t  " << medicine.getQuantity()
                 << "\t\t  " << medicine.getArrivalDate() << "\t" << medicine.getExpireDate() << endl;
        }
    }